

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O2

void labpack_write_u32(labpack_writer_t *writer,uint32_t value)

{
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x107,"void labpack_write_u32(labpack_writer_t *, uint32_t)");
  }
  if (writer->status != LABPACK_STATUS_OK) {
    return;
  }
  mpack_write_u32(writer->encoder,value);
  labpack_writer_check_encoder(writer);
  return;
}

Assistant:

void
labpack_write_u32(labpack_writer_t* writer, uint32_t value)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        mpack_write_u32(writer->encoder, value);
        labpack_writer_check_encoder(writer);
    }
}